

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

float ** Llb_ManComputeAttr(Llb_Mtr_t *p)

{
  uint uVar1;
  float **ppfVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  
  ppfVar2 = (float **)Extra_ArrayAlloc(p->nCols,p->nCols,4);
  uVar1 = p->nCols;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar6 = uVar1, uVar3 != uVar4; uVar3 = uVar3 + 1) {
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      ppfVar2[uVar3][uVar3] = 0.0;
    }
  }
  lVar5 = 2;
  for (lVar8 = 1; lVar7 = lVar5, lVar8 < (long)(int)uVar1 + -1; lVar8 = lVar8 + 1) {
    for (; (int)lVar7 < (int)((long)(int)uVar1 + -1); lVar7 = lVar7 + 1) {
      fVar10 = Llb_ManComputeCommonAttr(p,(int)lVar8,(int)lVar7);
      ppfVar2[lVar7][lVar8] = fVar10;
      ppfVar2[lVar8][lVar7] = fVar10;
    }
    lVar5 = lVar5 + 1;
  }
  return ppfVar2;
}

Assistant:

float ** Llb_ManComputeAttr( Llb_Mtr_t * p )
{
    float ** pCosts;
    int i, k;
    // alloc and clean
    pCosts = (float **)Extra_ArrayAlloc( p->nCols, p->nCols, sizeof(float) );
    for ( i = 0; i < p->nCols; i++ )
    for ( k = 0; k < p->nCols; k++ )
        pCosts[i][i] = 0.0;
    // fill up
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
        pCosts[i][k] = pCosts[k][i] = Llb_ManComputeCommonAttr( p, i, k );
    return pCosts;
}